

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

bool pbrt::Refract(Vector3f *wi,Normal3f *n,Float eta,Vector3f *wt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float fVar10;
  undefined1 auVar11 [16];
  Vector3<float> VVar12;
  undefined1 extraout_var [60];
  undefined1 auVar9 [56];
  
  auVar7._0_4_ = Dot<float>(n,wi);
  auVar7._4_60_ = extraout_var;
  auVar9 = extraout_var._4_56_;
  auVar11 = vfnmadd213ss_fma(auVar7._0_16_,auVar7._0_16_,SUB6416(ZEXT464(0x3f800000),0));
  auVar11 = vmaxss_avx(auVar11,ZEXT816(0) << 0x40);
  fVar10 = auVar11._0_4_ / (eta * eta);
  if (fVar10 < 1.0) {
    auVar11 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar10)),ZEXT816(0) << 0x40);
    auVar6 = vsqrtss_avx(auVar11,auVar11);
    VVar12 = Tuple3<pbrt::Vector3,_float>::operator-(&wi->super_Tuple3<pbrt::Vector3,_float>);
    auVar8._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar9;
    auVar11._4_4_ = eta;
    auVar11._0_4_ = eta;
    auVar11._8_4_ = eta;
    auVar11._12_4_ = eta;
    uVar2 = (n->super_Tuple3<pbrt::Normal3,_float>).x;
    uVar4 = (n->super_Tuple3<pbrt::Normal3,_float>).y;
    auVar11 = vdivps_avx(auVar8._0_16_,auVar11);
    fVar5 = auVar7._0_4_ / eta - auVar6._0_4_;
    fVar1 = (n->super_Tuple3<pbrt::Normal3,_float>).z;
    auVar6._0_4_ = fVar5 * (float)uVar2 + auVar11._0_4_;
    auVar6._4_4_ = fVar5 * (float)uVar4 + auVar11._4_4_;
    auVar6._8_4_ = fVar5 * 0.0 + auVar11._8_4_;
    auVar6._12_4_ = fVar5 * 0.0 + auVar11._12_4_;
    uVar3 = vmovlps_avx(auVar6);
    (wt->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar3;
    (wt->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar3 >> 0x20);
    (wt->super_Tuple3<pbrt::Vector3,_float>).z =
         VVar12.super_Tuple3<pbrt::Vector3,_float>.z / eta + fVar5 * fVar1;
  }
  return fVar10 < 1.0;
}

Assistant:

PBRT_CPU_GPU
inline bool Refract(const Vector3f &wi, const Normal3f &n, Float eta, Vector3f *wt) {
    // Compute $\cos\,\theta_\roman{t}$ using Snell's law
    Float cosTheta_i = Dot(n, wi);
    Float sin2Theta_i = std::max<Float>(0, 1 - cosTheta_i * cosTheta_i);
    Float sin2Theta_t = sin2Theta_i / Sqr(eta);
    // Handle total internal reflection for transmission
    if (sin2Theta_t >= 1)
        return false;

    Float cosTheta_t = SafeSqrt(1 - sin2Theta_t);

    *wt = -wi / eta + (cosTheta_i / eta - cosTheta_t) * Vector3f(n);
    return true;
}